

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_kdsingleapplication_localsocket_p.cpp
# Opt level: O3

void KDSingleApplicationLocalSocket::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  void *local_18;
  void *local_10;
  
  if (_c == IndexOfMethod) {
    if ((*_a[1] == messageReceived) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      bVar1 = sendMessage((KDSingleApplicationLocalSocket *)_o,(QByteArray *)_a[1],*_a[2]);
      if (*_a != (void *)0x0) {
        *(bool *)*_a = bVar1;
      }
    }
    else if (_id == 0) {
      local_10 = _a[1];
      local_18 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_18);
    }
  }
  return;
}

Assistant:

void KDSingleApplicationLocalSocket::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<KDSingleApplicationLocalSocket *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->messageReceived((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1]))); break;
        case 1: { bool _r = _t->sendMessage((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (KDSingleApplicationLocalSocket::*)(const QByteArray & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&KDSingleApplicationLocalSocket::messageReceived)) {
                *result = 0;
                return;
            }
        }
    }
}